

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O1

cmUVProcessChain __thiscall cmUVProcessChainBuilder::Start(cmUVProcessChainBuilder *this)

{
  bool bVar1;
  StdioConfiguration SVar2;
  long lVar3;
  ulong uVar4;
  pointer pPVar5;
  pointer *__ptr;
  cmUVProcessChainBuilder *in_RSI;
  size_t index;
  
  SVar2 = (StdioConfiguration)operator_new(0xb0);
  memset((void *)SVar2,0,0xb0);
  ((StreamData *)((long)SVar2 + 0x28))->BuiltinStream = -1;
  ((StreamData *)((long)SVar2 + 0x40))->BuiltinStream = -1;
  ((StreamData *)((long)SVar2 + 0x58))->BuiltinStream = -1;
  (((vector<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
     *)((long)SVar2 + 0x98))->
  super__Vector_base<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)((long)SVar2 + 0xa0) = (pointer)0x0;
  *(pointer *)((long)SVar2 + 0xa8) = (pointer)0x0;
  (((uv_pipe_ptr *)((long)SVar2 + 0x70))->super_uv_handle_ptr_<uv_pipe_s>).
  super_uv_handle_ptr_base_<uv_pipe_s>.handle.
  super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)SVar2 + 0x78))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (((uv_pipe_ptr *)((long)SVar2 + 0x80))->super_uv_handle_ptr_<uv_pipe_s>).
  super_uv_handle_ptr_base_<uv_pipe_s>.handle.
  super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)SVar2 + 0x88))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(uint *)((long)SVar2 + 0x90) = 0;
  (this->Stdio)._M_elems[0] = SVar2;
  bVar1 = cmUVProcessChain::InternalData::Prepare((InternalData *)SVar2,in_RSI);
  if (bVar1) {
    pPVar5 = (in_RSI->Processes).
             super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(in_RSI->Processes).
                  super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar5;
    if (lVar3 != 0) {
      uVar4 = (lVar3 >> 3) * -0x5555555555555555;
      lVar3 = 0;
      index = 0;
      do {
        cmUVProcessChain::InternalData::SpawnProcess
                  ((InternalData *)(this->Stdio)._M_elems[0],index,
                   (ProcessConfiguration *)
                   ((long)&(pPVar5->Arguments).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl + lVar3),index == 0,index == uVar4 - 1);
        index = index + 1;
        pPVar5 = (in_RSI->Processes).
                 super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar4 = ((long)(in_RSI->Processes).
                       super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar5 >> 3) *
                -0x5555555555555555;
        lVar3 = lVar3 + 0x18;
      } while (index < uVar4);
    }
    SVar2 = (this->Stdio)._M_elems[0];
    ::cm::uv_handle_ptr_base_<uv_pipe_s>::reset
              ((uv_handle_ptr_base_<uv_pipe_s> *)((long)SVar2 + 0x70));
    ::cm::uv_handle_ptr_base_<uv_pipe_s>::reset
              ((uv_handle_ptr_base_<uv_pipe_s> *)((long)SVar2 + 0x80));
    *(undefined1 *)((long)SVar2 + 8) = 1;
  }
  return (unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
          )(unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
            )this;
}

Assistant:

cmUVProcessChain cmUVProcessChainBuilder::Start() const
{
  cmUVProcessChain chain;

  if (!chain.Data->Prepare(this)) {
    return chain;
  }

  for (std::size_t i = 0; i < this->Processes.size(); i++) {
    chain.Data->SpawnProcess(i, this->Processes[i], i == 0,
                             i == this->Processes.size() - 1);
  }

  chain.Data->Finish();

  return chain;
}